

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O0

void __thiscall
TreeItem::TreeItem(TreeItem *this,UINT32 offset,UINT8 type,UINT8 subtype,CBString *name,
                  CBString *text,CBString *info,UByteArray *header,UByteArray *body,UByteArray *tail
                  ,bool fixed,bool compressed,TreeItem *parent)

{
  bool compressed_local;
  bool fixed_local;
  CBString *text_local;
  CBString *name_local;
  UINT8 subtype_local;
  UINT8 type_local;
  UINT32 offset_local;
  TreeItem *this_local;
  
  std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::list(&this->childItems);
  this->itemOffset = offset;
  this->itemAction = '2';
  this->itemType = type;
  this->itemSubtype = subtype;
  this->itemMarking = '\0';
  Bstrlib::CBString::CBString(&this->itemName,name);
  Bstrlib::CBString::CBString(&this->itemText,text);
  Bstrlib::CBString::CBString(&this->itemInfo,info);
  UByteArray::UByteArray(&this->itemHeader,header);
  UByteArray::UByteArray(&this->itemBody,body);
  UByteArray::UByteArray(&this->itemTail,tail);
  this->itemFixed = fixed;
  this->itemCompressed = compressed;
  UByteArray::UByteArray(&this->itemParsingData);
  UByteArray::UByteArray(&this->itemUncompressedData);
  this->parentItem = parent;
  return;
}

Assistant:

TreeItem::TreeItem(const UINT32 offset, const UINT8 type, const UINT8 subtype,
                   const UString & name, const UString & text, const UString & info,
                   const UByteArray & header, const UByteArray & body, const UByteArray & tail,
                   const bool fixed, const bool compressed,
                   TreeItem *parent) :
itemOffset(offset),
itemAction(Actions::NoAction),
itemType(type),
itemSubtype(subtype),
itemMarking(0),
itemName(name),
itemText(text),
itemInfo(info),
itemHeader(header),
itemBody(body),
itemTail(tail),
itemFixed(fixed),
itemCompressed(compressed),
parentItem(parent)
{
}